

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O3

FT_Bool tt_face_get_colorline_stops
                  (TT_Face face,FT_ColorStop *color_stop,FT_ColorStopIterator *iterator)

{
  FT_F2Dot14 *pFVar1;
  FT_Bool FVar2;
  Colr *colr;
  uint uVar3;
  undefined8 in_RAX;
  uint uVar4;
  byte *pbVar5;
  FT_Int item_deltas [2];
  undefined8 local_28;
  
  colr = (Colr *)face->colr;
  if ((colr != (Colr *)0x0) &&
     (iterator != (FT_ColorStopIterator *)0x0 && colr->table != (void *)0x0)) {
    uVar3 = iterator->current_color_stop;
    if ((uVar3 < iterator->num_color_stops) &&
       ((pbVar5 = iterator->p, colr->paints_start_v1 <= pbVar5 &&
        (FVar2 = iterator->read_variable, uVar4 = (uint)(FVar2 != '\0') * 4 + 6,
        pbVar5 + (iterator->num_color_stops + ~uVar3) * uVar4 <=
        (byte *)((long)colr->table + (colr->table_size - (ulong)uVar4)))))) {
      color_stop->stop_offset = ((long)(short)((ushort)*pbVar5 << 8) | (ulong)pbVar5[1]) << 2;
      (color_stop->color).palette_index =
           *(ushort *)(pbVar5 + 2) << 8 | *(ushort *)(pbVar5 + 2) >> 8;
      (color_stop->color).alpha = *(ushort *)(pbVar5 + 4) << 8 | *(ushort *)(pbVar5 + 4) >> 8;
      if (FVar2 == '\0') {
        pbVar5 = pbVar5 + 6;
      }
      else {
        uVar3 = *(uint *)(pbVar5 + 6);
        pbVar5 = pbVar5 + 10;
        local_28 = in_RAX;
        get_deltas_for_var_index_base
                  (face,colr,
                   (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                          uVar3 << 0x18),2,(FT_ItemVarDelta *)&local_28);
        color_stop->stop_offset = color_stop->stop_offset + (long)(int)local_28 * 4;
        pFVar1 = &(color_stop->color).alpha;
        *pFVar1 = *pFVar1 + local_28._4_2_;
        uVar3 = iterator->current_color_stop;
      }
      iterator->p = pbVar5;
      iterator->current_color_stop = uVar3 + 1;
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_colorline_stops( TT_Face                face,
                               FT_ColorStop*          color_stop,
                               FT_ColorStopIterator  *iterator )
  {
    Colr*  colr = (Colr*)face->colr;

    FT_Byte*  p;
    FT_ULong  var_index_base;
    FT_Byte*  last_entry_p = NULL;
    FT_UInt   entry_size   = COLOR_STOP_SIZE;


    if ( !colr || !colr->table || !iterator )
      return 0;

    if ( iterator->current_color_stop >= iterator->num_color_stops )
      return 0;

    if ( iterator->read_variable )
      entry_size += VAR_IDX_BASE_SIZE;

    /* Calculate the start pointer for the last to-be-read (Var)ColorStop */
    /* and check whether we can read a full (Var)ColorStop at that        */
    /* position by comparing it to the position that is the size of one   */
    /* (Var)ColorStop before the end of the 'COLR' table.                 */
    last_entry_p =
      iterator->p + ( iterator->num_color_stops - 1 -
                      iterator->current_color_stop ) * entry_size;
    if ( iterator->p < colr->paints_start_v1          ||
         last_entry_p > (FT_Byte*)colr->table +
                        colr->table_size - entry_size )
      return 0;

    /* Iterator points at first `ColorStop` of `ColorLine`. */
    p = iterator->p;

    color_stop->stop_offset = F2DOT14_TO_FIXED( FT_NEXT_SHORT( p ) );

    color_stop->color.palette_index = FT_NEXT_USHORT( p );

    color_stop->color.alpha = FT_NEXT_SHORT( p );

    if ( iterator->read_variable )
    {
      /* Pointer p needs to be advanced independently of whether we intend */
      /* to take variable deltas into account or not.  Otherwise iteration */
      /* would fail due to wrong offsets.                                  */
      var_index_base = FT_NEXT_ULONG( p );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      {
        FT_Int  item_deltas[2];


        if ( !get_deltas_for_var_index_base( face, colr,
                                             var_index_base,
                                             2,
                                             item_deltas ) )
          return 0;

        color_stop->stop_offset += F2DOT14_TO_FIXED( item_deltas[0] );
        color_stop->color.alpha += item_deltas[1];
      }
#else
      FT_UNUSED( var_index_base );
#endif
    }

    iterator->p = p;
    iterator->current_color_stop++;

    return 1;
  }